

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

bool __thiscall cmCacheManager::DeleteCache(cmCacheManager *this,string *path)

{
  bool bVar1;
  char *pcVar2;
  undefined1 local_68 [8];
  string cmakeFiles;
  undefined1 local_38 [8];
  string cacheFile;
  string *path_local;
  cmCacheManager *this_local;
  
  cacheFile.field_2._8_8_ = path;
  std::__cxx11::string::string((string *)local_38,(string *)path);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)local_38);
  std::__cxx11::string::string((string *)local_68,(string *)local_38);
  std::__cxx11::string::operator+=((string *)local_38,"/CMakeCache.txt");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::SystemTools::FileExists(pcVar2);
  if (bVar1) {
    cmsys::SystemTools::RemoveFile((string *)local_38);
    pcVar2 = cmake::GetCMakeFilesDirectory();
    std::__cxx11::string::operator+=((string *)local_68,pcVar2);
    bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_68);
    if (bVar1) {
      cmsys::SystemTools::RemoveADirectory((string *)local_68);
    }
  }
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return true;
}

Assistant:

bool cmCacheManager::DeleteCache(const std::string& path)
{
  std::string cacheFile = path;
  cmSystemTools::ConvertToUnixSlashes(cacheFile);
  std::string cmakeFiles = cacheFile;
  cacheFile += "/CMakeCache.txt";
  if(cmSystemTools::FileExists(cacheFile.c_str()))
    {
    cmSystemTools::RemoveFile(cacheFile);
    // now remove the files in the CMakeFiles directory
    // this cleans up language cache files
    cmakeFiles += cmake::GetCMakeFilesDirectory();
    if(cmSystemTools::FileIsDirectory(cmakeFiles))
      {
      cmSystemTools::RemoveADirectory(cmakeFiles);
      }
    }
  return true;
}